

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O2

int yy_list_prefix_expr(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  char *cclass;
  int yypos750;
  code *pcVar10;
  char *pcVar11;
  int yypos758;
  int yythunkpos758;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  yyDo(G,yyPush,4,0,"yyPush");
  iVar8 = G->pos;
  iVar3 = G->thunkpos;
  iVar5 = yymatchChar(G,0x5b);
  if (iVar5 != 0) {
    iVar5 = G->pos;
    iVar9 = G->thunkpos;
    yyText(G,G->begin,G->end);
    G->begin = G->pos;
    iVar6 = yymatchChar(G,0x2a);
    if (iVar6 == 0) {
      G->pos = iVar5;
      G->thunkpos = iVar9;
      yyText(G,G->begin,G->end);
      G->begin = G->pos;
      iVar6 = yymatchChar(G,0x2b);
      if (iVar6 == 0) {
LAB_00114d1f:
        G->pos = iVar5;
        G->thunkpos = iVar9;
        yyText(G,G->begin,G->end);
        G->begin = G->pos;
        iVar6 = yymatchChar(G,0x2d);
        if (iVar6 == 0) {
          G->pos = iVar5;
          G->thunkpos = iVar9;
          yyText(G,G->begin,G->end);
          G->begin = G->pos;
          iVar6 = yymatchString(G,"<=");
          if (iVar6 == 0) {
            G->pos = iVar5;
            G->thunkpos = iVar9;
            yyText(G,G->begin,G->end);
            G->begin = G->pos;
            iVar6 = yymatchString(G,">=");
            if (iVar6 == 0) {
              G->pos = iVar5;
              G->thunkpos = iVar9;
              yyText(G,G->begin,G->end);
              iVar5 = G->pos;
              iVar9 = G->thunkpos;
              G->begin = iVar5;
              iVar6 = yymatchString(G,"min");
              if (iVar6 == 0) {
                G->pos = iVar5;
                G->thunkpos = iVar9;
                iVar6 = yymatchString(G,"max");
                if (iVar6 == 0) {
                  G->pos = iVar5;
                  G->thunkpos = iVar9;
                  iVar5 = yymatchString(G,"gcd");
                  if (iVar5 == 0) goto LAB_00114f82;
                }
              }
              yyText(G,G->begin,G->end);
              iVar5 = G->pos;
              iVar9 = G->begin;
              G->end = iVar5;
              pcVar10 = yy_6_reduce_operator;
              pcVar11 = "yy_6_reduce_operator";
            }
            else {
              yyText(G,G->begin,G->end);
              iVar5 = G->pos;
              iVar9 = G->begin;
              G->end = iVar5;
              pcVar10 = yy_5_reduce_operator;
              pcVar11 = "yy_5_reduce_operator";
            }
          }
          else {
            yyText(G,G->begin,G->end);
            iVar5 = G->pos;
            iVar9 = G->begin;
            G->end = iVar5;
            pcVar10 = yy_4_reduce_operator;
            pcVar11 = "yy_4_reduce_operator";
          }
          goto LAB_00114cbf;
        }
        yyText(G,G->begin,G->end);
        iVar9 = G->pos;
        iVar5 = G->begin;
        G->end = iVar9;
        pcVar10 = yy_3_reduce_operator;
        pcVar11 = "yy_3_reduce_operator";
      }
      else {
        iVar6 = G->pos;
        iVar4 = G->thunkpos;
        iVar7 = yymatchClass(G,(uchar *)"",cclass);
        if (iVar7 != 0) goto LAB_00114d1f;
        G->pos = iVar6;
        G->thunkpos = iVar4;
        yyText(G,G->begin,G->end);
        iVar9 = G->pos;
        iVar5 = G->begin;
        G->end = iVar9;
        pcVar10 = yy_2_reduce_operator;
        pcVar11 = "yy_2_reduce_operator";
      }
      yyDo(G,pcVar10,iVar5,iVar9,pcVar11);
    }
    else {
      yyText(G,G->begin,G->end);
      iVar5 = G->pos;
      iVar9 = G->begin;
      G->end = iVar5;
      pcVar10 = yy_1_reduce_operator;
      pcVar11 = "yy_1_reduce_operator";
LAB_00114cbf:
      yyDo(G,pcVar10,iVar9,iVar5,pcVar11);
    }
    yyDo(G,yySet,-4,0,"yySet");
    iVar5 = yymatchChar(G,0x5d);
    if (iVar5 != 0) {
      yy__(G);
      iVar5 = yy_list_infix_expr(G);
      if (iVar5 != 0) {
        yyDo(G,yySet,-3,0,"yySet");
        yyDo(G,yy_1_list_prefix_expr,G->begin,G->end,"yy_1_list_prefix_expr");
        goto LAB_001151a9;
      }
    }
  }
LAB_00114f82:
  G->pos = iVar8;
  G->thunkpos = iVar3;
  iVar8 = yy_list_infix_expr(G);
  if (iVar8 == 0) {
    G->pos = iVar1;
    G->thunkpos = iVar2;
    return 0;
  }
  yyDo(G,yySet,-2,0,"yySet");
  yyDo(G,yy_2_list_prefix_expr,G->begin,G->end,"yy_2_list_prefix_expr");
LAB_00114fd7:
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  yy__(G);
  iVar8 = yymatchChar(G,0x3d);
  if (iVar8 != 0) {
    iVar8 = G->pos;
    iVar3 = G->thunkpos;
    iVar5 = yymatchChar(G,0x3d);
    if (iVar5 == 0) {
      G->pos = iVar8;
      G->thunkpos = iVar3;
      yy__(G);
      iVar8 = yy_list_prefix_expr(G);
      if (iVar8 != 0) {
        yyDo(G,yySet,-1,0,"yySet");
        yyDo(G,yy_3_list_prefix_expr,G->begin,G->end,"yy_3_list_prefix_expr");
        goto LAB_00114fd7;
      }
    }
  }
  G->pos = iVar1;
  G->thunkpos = iVar2;
  yy__(G);
  iVar8 = yymatchString(G,":=");
  if (iVar8 != 0) {
    iVar8 = G->pos;
    iVar3 = G->thunkpos;
    iVar5 = yymatchChar(G,0x3d);
    if (iVar5 != 0) goto LAB_0011504c;
    G->pos = iVar8;
    G->thunkpos = iVar3;
    yy__(G);
    iVar8 = yy_list_prefix_expr(G);
    if (iVar8 == 0) goto LAB_0011504c;
    yyDo(G,yySet,-1,0,"yySet");
    yyDo(G,yy_4_list_prefix_expr,G->begin,G->end,"yy_4_list_prefix_expr");
    goto LAB_00114fd7;
  }
LAB_0011504c:
  G->pos = iVar1;
  G->thunkpos = iVar2;
  yy__(G);
  iVar8 = yymatchString(G,"::=");
  if (iVar8 != 0) {
    iVar8 = G->pos;
    iVar3 = G->thunkpos;
    iVar5 = yymatchChar(G,0x3d);
    if (iVar5 != 0) goto LAB_001151a1;
    G->pos = iVar8;
    G->thunkpos = iVar3;
    yy__(G);
    iVar8 = yy_list_prefix_expr(G);
    if (iVar8 == 0) goto LAB_001151a1;
    yyDo(G,yySet,-1,0,"yySet");
    yyDo(G,yy_5_list_prefix_expr,G->begin,G->end,"yy_5_list_prefix_expr");
    goto LAB_00114fd7;
  }
LAB_001151a1:
  G->pos = iVar1;
  G->thunkpos = iVar2;
LAB_001151a9:
  yyDo(G,yyPop,4,0,"yyPop");
  return 1;
}

Assistant:

YY_RULE(int) yy_list_prefix_expr(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyDo(G, yyPush, 4, 0, "yyPush");
  yyprintfv((stderr, "%s\n", "list_prefix_expr"));

  {  int yypos754= G->pos, yythunkpos754= G->thunkpos;  if (!yymatchChar(G, '[')) goto l755;
  if (!yy_reduce_operator(G))  goto l755;
  yyDo(G, yySet, -4, 0, "yySet");
  if (!yymatchChar(G, ']')) goto l755;
  if (!yy__(G))  goto l755;
  if (!yy_list_infix_expr(G))  goto l755;
  yyDo(G, yySet, -3, 0, "yySet");
  yyDo(G, yy_1_list_prefix_expr, G->begin, G->end, "yy_1_list_prefix_expr");
  goto l754;
  l755:;	  G->pos= yypos754; G->thunkpos= yythunkpos754;  if (!yy_list_infix_expr(G))  goto l753;
  yyDo(G, yySet, -2, 0, "yySet");
  yyDo(G, yy_2_list_prefix_expr, G->begin, G->end, "yy_2_list_prefix_expr");

  l756:;	
  {  int yypos757= G->pos, yythunkpos757= G->thunkpos;
  {  int yypos758= G->pos, yythunkpos758= G->thunkpos;  if (!yy__(G))  goto l759;
  if (!yymatchChar(G, '=')) goto l759;

  {  int yypos760= G->pos, yythunkpos760= G->thunkpos;  if (!yymatchChar(G, '=')) goto l760;
  goto l759;
  l760:;	  G->pos= yypos760; G->thunkpos= yythunkpos760;
  }  if (!yy__(G))  goto l759;
  if (!yy_list_prefix_expr(G))  goto l759;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_3_list_prefix_expr, G->begin, G->end, "yy_3_list_prefix_expr");
  goto l758;
  l759:;	  G->pos= yypos758; G->thunkpos= yythunkpos758;  if (!yy__(G))  goto l761;
  if (!yymatchString(G, ":=")) goto l761;

  {  int yypos762= G->pos, yythunkpos762= G->thunkpos;  if (!yymatchChar(G, '=')) goto l762;
  goto l761;
  l762:;	  G->pos= yypos762; G->thunkpos= yythunkpos762;
  }  if (!yy__(G))  goto l761;
  if (!yy_list_prefix_expr(G))  goto l761;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_4_list_prefix_expr, G->begin, G->end, "yy_4_list_prefix_expr");
  goto l758;
  l761:;	  G->pos= yypos758; G->thunkpos= yythunkpos758;  if (!yy__(G))  goto l757;
  if (!yymatchString(G, "::=")) goto l757;

  {  int yypos763= G->pos, yythunkpos763= G->thunkpos;  if (!yymatchChar(G, '=')) goto l763;
  goto l757;
  l763:;	  G->pos= yypos763; G->thunkpos= yythunkpos763;
  }  if (!yy__(G))  goto l757;
  if (!yy_list_prefix_expr(G))  goto l757;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_5_list_prefix_expr, G->begin, G->end, "yy_5_list_prefix_expr");

  }
  l758:;	  goto l756;
  l757:;	  G->pos= yypos757; G->thunkpos= yythunkpos757;
  }
  }
  l754:;	  yyprintf((stderr, "  ok   list_prefix_expr"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));
  yyDo(G, yyPop, 4, 0, "yyPop");
  return 1;
  l753:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "list_prefix_expr"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}